

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<char32_t>(char32_t t,bool t_return_value)

{
  Type_Info *__args;
  byte in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  element_type *ptr;
  shared_ptr<char32_t> p;
  bool *in_stack_ffffffffffffffb8;
  char32_t **in_stack_ffffffffffffffc0;
  shared_ptr<char32_t> *in_stack_ffffffffffffffc8;
  Any *in_stack_ffffffffffffffd0;
  __shared_ptr<char32_t,_(__gnu_cxx::_Lock_policy)2> local_20;
  byte local_d;
  
  local_d = in_DL & 1;
  std::make_shared<char32_t,char32_t>((char32_t *)in_stack_ffffffffffffffb8);
  __args = (Type_Info *)std::__shared_ptr<char32_t,_(__gnu_cxx::_Lock_policy)2>::get(&local_20);
  chaiscript::detail::Get_Type_Info<char32_t>::get();
  chaiscript::detail::Any::Any<std::shared_ptr<char32_t>,void>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,char32_t*&,bool&>
            (__args,in_stack_ffffffffffffffd0,(bool *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  chaiscript::detail::Any::~Any((Any *)0x20dfb4);
  std::shared_ptr<char32_t>::~shared_ptr((shared_ptr<char32_t> *)0x20dfbe);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static std::shared_ptr<Data> get(T t, bool t_return_value)
          {
            auto p = std::make_shared<T>(std::move(t));
            auto ptr = p.get();
            return std::make_shared<Data>(
                  detail::Get_Type_Info<T>::get(), 
                  chaiscript::detail::Any(std::move(p)),
                  false,
                  ptr,
                  t_return_value
                );
          }